

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O2

bool __thiscall tlx::CmdlineParser::process(CmdlineParser *this,int argc,char **argv,ostream *os)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  size_t sVar5;
  ostream *poVar6;
  Argument *pAVar7;
  ulong uVar8;
  pointer ppAVar9;
  ulong uVar10;
  pointer ppAVar11;
  char **ppcVar12;
  uint uVar13;
  uint uVar14;
  uint local_7c;
  ostream *local_78;
  char **local_70;
  pointer local_68;
  uint local_5c;
  CmdlineParser *local_58;
  string local_50;
  
  this->program_name_ = *argv;
  uVar13 = argc - 1;
  ppcVar12 = argv + 1;
  uVar8 = 0;
  uVar10 = 0;
  local_7c = uVar13;
  local_78 = os;
  local_70 = ppcVar12;
  if (0 < (int)uVar13) {
    uVar10 = (ulong)uVar13;
  }
  do {
    poVar6 = local_78;
    if (uVar10 == uVar8) {
      bVar2 = false;
      ppAVar9 = (this->param_list_).
                super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_58 = this;
      goto LAB_0014c535;
    }
    pcVar1 = ppcVar12[uVar8];
    if (((*pcVar1 == '-') && (pcVar1[1] == 'h')) && (pcVar1[2] == '\0')) break;
    iVar3 = strcmp(pcVar1,"--help");
    uVar8 = uVar8 + 1;
    poVar6 = local_78;
  } while (iVar3 != 0);
  goto LAB_0014c8e2;
LAB_0014c535:
  if (uVar13 != 0) {
    pcVar1 = *local_70;
    local_68 = ppAVar9;
    if (*pcVar1 == '-' && !bVar2) {
      uVar14 = uVar13 - 1;
      local_70 = local_70 + 1;
      local_7c = uVar14;
      if (pcVar1[1] == '\0') {
        poVar4 = std::operator<<(poVar6,"Invalid option \"");
        poVar4 = std::operator<<(poVar4,pcVar1);
        poVar4 = std::operator<<(poVar4,"\".");
        std::endl<char,std::char_traits<char>>(poVar4);
LAB_0014c83e:
        bVar2 = false;
        ppAVar9 = local_68;
        uVar13 = local_7c;
      }
      else if (pcVar1[1] == '-') {
        bVar2 = true;
        uVar13 = uVar14;
        if (pcVar1[2] != '-') {
          for (ppAVar9 = (this->option_list_).
                         super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              ppAVar9 !=
              (this->option_list_).
              super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
              ._M_impl.super__Vector_impl_data._M_finish; ppAVar9 = ppAVar9 + 1) {
            bVar2 = std::operator==(pcVar1 + 2,&(*ppAVar9)->longkey_);
            if (bVar2) {
              iVar3 = (*(*ppAVar9)->_vptr_Argument[3])(*ppAVar9,&local_7c,&local_70);
              if ((char)iVar3 == '\0') {
                pAVar7 = *ppAVar9;
LAB_0014c90d:
                print_option_error(this,local_7c,local_70,pAVar7,poVar6);
                return false;
              }
              if (this->verbose_process_ == true) {
                poVar4 = std::operator<<(poVar6,"Option ");
                Argument::option_text_abi_cxx11_(&local_50,*ppAVar9);
                poVar4 = std::operator<<(poVar4,(string *)&local_50);
                std::operator<<(poVar4," set to ");
                std::__cxx11::string::~string((string *)&local_50);
                (*(*ppAVar9)->_vptr_Argument[4])(*ppAVar9,poVar6);
                poVar4 = std::operator<<(poVar6,'.');
                std::endl<char,std::char_traits<char>>(poVar4);
              }
              break;
            }
          }
          if (ppAVar9 !=
              (this->option_list_).
              super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0014c83e;
          poVar4 = std::operator<<(poVar6,"Error: unknown option \"");
          poVar4 = std::operator<<(poVar4,pcVar1);
          poVar4 = std::operator<<(poVar4,"\".");
          poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
          std::endl<char,std::char_traits<char>>(poVar4);
          goto LAB_0014c8e2;
        }
      }
      else {
        sVar5 = strlen(pcVar1);
        uVar8 = 1;
        local_5c = uVar14;
        while ((bVar2 = false, poVar6 = local_78, ppAVar9 = local_68, uVar13 = local_7c,
               uVar8 < sVar5 && (local_7c == uVar14))) {
          ppAVar11 = (this->option_list_).
                     super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          for (ppAVar9 = (this->option_list_).
                         super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
                         ._M_impl.super__Vector_impl_data._M_start; ppAVar9 != ppAVar11;
              ppAVar9 = ppAVar9 + 1) {
            pAVar7 = *ppAVar9;
            if (pcVar1[uVar8] == pAVar7->key_) {
              iVar3 = (*pAVar7->_vptr_Argument[3])(pAVar7,&local_7c,&local_70);
              if ((char)iVar3 == '\0') {
                pAVar7 = *ppAVar9;
                poVar6 = local_78;
                goto LAB_0014c90d;
              }
              uVar8 = uVar8 + 1;
              ppAVar11 = ppAVar9;
              uVar14 = local_5c;
              if (this->verbose_process_ == true) {
                poVar6 = std::operator<<(local_78,"Option ");
                Argument::option_text_abi_cxx11_(&local_50,*ppAVar9);
                poVar6 = std::operator<<(poVar6,(string *)&local_50);
                std::operator<<(poVar6," set to ");
                std::__cxx11::string::~string((string *)&local_50);
                poVar6 = local_78;
                (*(*ppAVar9)->_vptr_Argument[4])(*ppAVar9,local_78);
                poVar6 = std::operator<<(poVar6,'.');
                std::endl<char,std::char_traits<char>>(poVar6);
                this = local_58;
                uVar14 = local_5c;
              }
              break;
            }
          }
          poVar6 = local_78;
          if (ppAVar11 ==
              (this->option_list_).
              super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::operator<<(local_78,"Error: unknown option \"");
            if (2 < sVar5) {
              poVar4 = std::operator<<(poVar6,"-");
              poVar4 = std::operator<<(poVar4,pcVar1[uVar8]);
              poVar4 = std::operator<<(poVar4,"\" at position ");
              poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
              std::operator<<(poVar4," in option sequence \"");
            }
            poVar4 = std::operator<<(poVar6,pcVar1);
            poVar4 = std::operator<<(poVar4,"\".");
            poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
            goto LAB_0014c8d7;
          }
        }
      }
    }
    else {
      if (ppAVar9 ==
          (this->param_list_).
          super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        poVar4 = std::operator<<(poVar6,"Error: unexpected extra argument ");
        poVar4 = std::operator<<(poVar4,"\"");
        poVar4 = std::operator<<(poVar4,*local_70);
        poVar4 = std::operator<<(poVar4,"\".");
        poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
        std::endl<char,std::char_traits<char>>(poVar4);
        local_7c = local_7c - 1;
        local_70 = local_70 + 1;
        goto LAB_0014c8e2;
      }
      iVar3 = (*(*ppAVar9)->_vptr_Argument[3])(*ppAVar9,&local_7c,&local_70);
      if ((char)iVar3 == '\0') {
        print_param_error(this,local_7c,local_70,*ppAVar9,poVar6);
        return false;
      }
      if (this->verbose_process_ == true) {
        poVar4 = std::operator<<(poVar6,"Parameter ");
        Argument::param_text_abi_cxx11_(&local_50,*ppAVar9);
        poVar4 = std::operator<<(poVar4,(string *)&local_50);
        std::operator<<(poVar4," set to ");
        std::__cxx11::string::~string((string *)&local_50);
        (*(*ppAVar9)->_vptr_Argument[4])(*ppAVar9,poVar6);
        poVar4 = std::operator<<(poVar6,'.');
        std::endl<char,std::char_traits<char>>(poVar4);
        this = local_58;
      }
      pAVar7 = *ppAVar9;
      pAVar7->found_ = true;
      ppAVar9 = ppAVar9 + (pAVar7->repeated_ ^ 1);
      uVar13 = local_7c;
    }
    goto LAB_0014c535;
  }
  bVar2 = true;
  for (ppAVar9 = (this->param_list_).
                 super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppAVar9 !=
      (this->param_list_).
      super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppAVar9 = ppAVar9 + 1) {
    if (((*ppAVar9)->required_ == true) && ((*ppAVar9)->found_ == false)) {
      poVar6 = std::operator<<(local_78,"Error: argument for parameter ");
      poVar6 = std::operator<<(poVar6,(string *)&(*ppAVar9)->longkey_);
      poVar6 = std::operator<<(poVar6," is required!");
      std::endl<char,std::char_traits<char>>(poVar6);
      bVar2 = false;
    }
  }
  poVar6 = local_78;
  poVar4 = local_78;
  if (bVar2) {
    return true;
  }
LAB_0014c8d7:
  std::endl<char,std::char_traits<char>>(poVar4);
LAB_0014c8e2:
  print_usage(this,poVar6);
  return false;
}

Assistant:

bool CmdlineParser::process(
    int argc, const char* const* argv, std::ostream& os) {
    program_name_ = argv[0];
    --argc, ++argv;

    // search for help string and output help
    for (int i = 0; i < argc; ++i) {
        if (strcmp(argv[i], "-h") == 0 || strcmp(argv[i], "--help") == 0) {
            print_usage(os);
            return false;
        }
    }

    // current argument in param_list_
    ArgumentList::iterator argi = param_list_.begin();
    bool end_optlist = false;

    while (argc != 0) {
        const char* arg = argv[0];

        if (arg[0] == '-' && !end_optlist) {
            // option, advance to argument
            --argc, ++argv;
            if (arg[1] == '-') {
                if (arg[2] == '-') {
                    end_optlist = true;
                }
                else {
                    // long option
                    ArgumentList::const_iterator oi = option_list_.begin();
                    for ( ; oi != option_list_.end(); ++oi) {
                        if ((arg + 2) == (*oi)->longkey_) {
                            if (!(*oi)->process(argc, argv)) {
                                print_option_error(argc, argv, *oi, os);
                                return false;
                            }
                            else if (verbose_process_) {
                                os << "Option " << (*oi)->option_text()
                                   << " set to ";
                                (*oi)->print_value(os);
                                os << '.' << std::endl;
                            }
                            break;
                        }
                    }
                    if (oi == option_list_.end()) {
                        os << "Error: unknown option \"" << arg << "\"."
                           << std::endl << std::endl;
                        print_usage(os);
                        return false;
                    }
                }
            }
            else {
                // short option
                if (arg[1] == 0) {
                    os << "Invalid option \"" << arg << "\"." << std::endl;
                }
                else {
                    size_t offset = 1, arg_length = strlen(arg);
                    int old_argc = argc;
                    // Arguments will increase argc, so abort if it increases,
                    // while flags won't, so increase offset and parse next
                    while (offset < arg_length && argc == old_argc) {
                        ArgumentList::const_iterator oi = option_list_.begin();
                        for ( ; oi != option_list_.end(); ++oi) {
                            if (arg[offset] == (*oi)->key_) {
                                ++offset;
                                if (!(*oi)->process(argc, argv)) {
                                    print_option_error(argc, argv, *oi, os);
                                    return false;
                                }
                                else if (verbose_process_) {
                                    os << "Option "
                                       << (*oi)->option_text()
                                       << " set to ";
                                    (*oi)->print_value(os);
                                    os << '.' << std::endl;
                                }
                                break;
                            }
                        }
                        if (oi == option_list_.end()) {
                            os << "Error: unknown option \"";
                            if (arg_length > 2) {
                                // multiple short options combined
                                os << "-" << arg[offset]
                                   << "\" at position " << offset
                                   << " in option sequence \"";
                            }
                            os << arg << "\"." << std::endl << std::endl;
                            print_usage(os);
                            return false;
                        }
                    }
                }
            }
        }
        else {
            if (argi != param_list_.end()) {
                if (!(*argi)->process(argc, argv)) {
                    print_param_error(argc, argv, *argi, os);
                    return false;
                }
                else if (verbose_process_) {
                    os << "Parameter " << (*argi)->param_text() << " set to ";
                    (*argi)->print_value(os);
                    os << '.' << std::endl;
                }
                (*argi)->found_ = true;
                if (!(*argi)->repeated_)
                    ++argi;
            }
            else {
                os << "Error: unexpected extra argument "
                   << "\"" << argv[0] << "\"." << std::endl << std::endl;
                --argc, ++argv;
                print_usage(os);
                return false;
            }
        }
    }

    bool good = true;

    for (ArgumentList::const_iterator it = param_list_.begin();
         it != param_list_.end(); ++it) {
        if ((*it)->required_ && !(*it)->found_) {
            os << "Error: argument for parameter " << (*it)->longkey_
               << " is required!" << std::endl;
            good = false;
        }
    }

    if (!good) {
        os << std::endl;
        print_usage(os);
    }

    return good;
}